

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.cpp
# Opt level: O0

void __thiscall gamespace::BoardTile::__introspect(BoardTile *this,size_t off)

{
  ostream *poVar1;
  allocator local_39;
  string local_38 [32];
  size_t local_18;
  size_t off_local;
  BoardTile *this_local;
  
  local_18 = off;
  off_local = (size_t)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,off,' ',&local_39);
  poVar1 = std::operator<<((ostream *)&std::cout,local_38);
  poVar1 = std::operator<<(poVar1,"BoardTile[");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->_p).x);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->_p).y);
  poVar1 = std::operator<<(poVar1,"]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if (this->_unit != (Unit *)0x0) {
    Unit::__introspect(this->_unit,local_18 + 2);
  }
  return;
}

Assistant:

void BoardTile::__introspect(size_t off) {
    std::cout << std::string(off, ' ') << "BoardTile[" << _p.x << "," << _p.y << "]" << std::endl;
    if(_unit) _unit->__introspect(off + 2);
}